

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O2

vector<int,_std::allocator<int>_> *
cppqc::ArbitraryImpl<std::vector<int,_std::allocator<int>_>_>::unGen
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,RngEngine *rng,size_t size)

{
  pointer *__ptr;
  long *local_28;
  _Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false> local_20;
  
  local_20._M_head_impl = (StatelessGenConcept<int> *)operator_new(0x10);
  ((local_20._M_head_impl)->super_GenConcept<int>)._vptr_GenConcept =
       (_func_int **)&PTR__GenConcept_00110c90;
  listOf<int>((cppqc *)&local_28,(StatelessGenerator<int> *)&local_20);
  (**(code **)(*local_28 + 0x10))(__return_storage_ptr__,local_28,rng,size);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  local_28 = (long *)0x0;
  if (local_20._M_head_impl != (StatelessGenConcept<int> *)0x0) {
    (*((local_20._M_head_impl)->super_GenConcept<int>)._vptr_GenConcept[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<T> unGen(RngEngine& rng, std::size_t size) {
    return listOf<T>().unGen(rng, size);
  }